

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmServer.cxx
# Opt level: O1

bool __thiscall cmServer::Serve(cmServer *this,string *errorMessage)

{
  bool bVar1;
  
  if ((this->SupportedProtocols).
      super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->SupportedProtocols).
      super__Vector_base<cmServerProtocol_*,_std::allocator<cmServerProtocol_*>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    std::__cxx11::string::_M_replace
              ((ulong)errorMessage,0,(char *)errorMessage->_M_string_length,0x4e4795);
    return false;
  }
  if (this->Protocol == (cmServerProtocol *)0x0) {
    bVar1 = cmServerBase::Serve(&this->super_cmServerBase,errorMessage);
    return bVar1;
  }
  __assert_fail("!this->Protocol",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmServer.cxx"
                ,0xf1,"virtual bool cmServer::Serve(std::string *)");
}

Assistant:

bool cmServer::Serve(std::string* errorMessage)
{
  if (this->SupportedProtocols.empty()) {
    *errorMessage =
      "No protocol versions defined. Maybe you need --experimental?";
    return false;
  }
  assert(!this->Protocol);

  return cmServerBase::Serve(errorMessage);
}